

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

real __thiscall
fasttext::BinaryLogisticLoss::binaryLogistic
          (BinaryLogisticLoss *this,int32_t target,State *state,bool labelIsPositive,real lr,
          bool backprop)

{
  element_type *peVar1;
  undefined1 auVar2 [16];
  undefined3 in_register_00000081;
  long i;
  undefined1 auVar3 [16];
  real x;
  float fVar4;
  
  peVar1 = (((this->super_Loss).wo_)->
           super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  i = (long)target;
  x = lr;
  (*peVar1->_vptr_Matrix[2])(peVar1,&state->hidden,i);
  fVar4 = Loss::sigmoid(&this->super_Loss,x);
  if (CONCAT31(in_register_00000081,backprop) != 0) {
    Vector::addRow(&state->grad,
                   (((this->super_Loss).wo_)->
                   super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,i,
                   ((float)labelIsPositive - fVar4) * lr);
    peVar1 = (((this->super_Loss).wo_)->
             super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_Matrix[3])(peVar1,&state->hidden,i);
  }
  if (!labelIsPositive) {
    fVar4 = 1.0 - fVar4;
  }
  auVar3 = ZEXT816(0);
  if (fVar4 <= 1.0) {
    auVar3 = ZEXT416((uint)(this->super_Loss).t_log_.
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[(long)(fVar4 * 512.0)]);
  }
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar3,auVar2);
  return auVar3._0_4_;
}

Assistant:

real BinaryLogisticLoss::binaryLogistic(
    int32_t target,
    Model::State& state,
    bool labelIsPositive,
    real lr,
    bool backprop) const {
  real score = sigmoid(wo_->dotRow(state.hidden, target));
  if (backprop) {
    real alpha = lr * (real(labelIsPositive) - score);
    state.grad.addRow(*wo_, target, alpha);
    wo_->addVectorToRow(state.hidden, target, alpha);
  }
  if (labelIsPositive) {
    return -log(score);
  } else {
    return -log(1.0 - score);
  }
}